

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void am_generic_add_part(Am_Object *owner,Am_Object *old_object,Am_Object *new_object)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  bool local_da;
  bool local_99;
  Am_Slot local_78;
  byte local_6a;
  byte local_69;
  bool was_valid;
  Am_Slot local_60;
  Am_Object local_58;
  Am_Object current_obj;
  int current_rank;
  undefined1 local_30 [8];
  Am_Value_List components;
  Am_Object *new_object_local;
  Am_Object *old_object_local;
  Am_Object *owner_local;
  
  components.item = (Am_List_Item *)new_object;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  current_obj.data._7_1_ = 0;
  bVar1 = Am_Object::Valid(old_object);
  local_99 = false;
  if (bVar1) {
    Am_Object::Am_Object((Am_Object *)&current_rank,&Am_Graphical_Object);
    current_obj.data._7_1_ = 1;
    local_99 = Am_Object::Is_Instance_Of(old_object,(Am_Object *)&current_rank);
  }
  if ((current_obj.data._7_1_ & 1) != 0) {
    Am_Object::~Am_Object((Am_Object *)&current_rank);
  }
  if (local_99 != false) {
    Am_Object::Make_Unique(owner,0x82);
    pAVar3 = Am_Object::Get(owner,0x82,0);
    Am_Value_List::operator=((Am_Value_List *)local_30,pAVar3);
    Am_Value_List::Start((Am_Value_List *)local_30);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(old_object);
    bVar1 = Am_Value_List::Member((Am_Value_List *)local_30,pAVar4);
    if (bVar1) {
      Am_Value_List::Delete((Am_Value_List *)local_30,false);
      pAVar3 = Am_Object::Get(old_object,0x85,0);
      current_obj.data._0_4_ = Am_Value::operator_cast_to_int(pAVar3);
      Am_Value_List::Next((Am_Value_List *)local_30);
      Am_Object::Am_Object(&local_58);
      while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
        pAVar3 = Am_Value_List::Get((Am_Value_List *)local_30);
        Am_Object::operator=(&local_58,pAVar3);
        Am_Object::Set(&local_58,0x85,(int)current_obj.data,0);
        current_obj.data._0_4_ = (int)current_obj.data + 1;
        Am_Value_List::Next((Am_Value_List *)local_30);
      }
      local_60 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)old_object,100);
      Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_move,0,&local_60);
      Am_Object::Note_Changed(owner,0x82);
      Am_Object::~Am_Object(&local_58);
    }
  }
  local_69 = 0;
  bVar1 = Am_Object::Valid(new_object);
  local_da = false;
  if (bVar1) {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff98,&Am_Graphical_Object);
    local_69 = 1;
    local_da = Am_Object::Is_Instance_Of(new_object,(Am_Object *)&stack0xffffffffffffff98);
  }
  if ((local_69 & 1) != 0) {
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff98);
  }
  if (local_da != false) {
    Am_Object::Make_Unique(owner,0x82);
    pAVar3 = Am_Object::Get(owner,0x82,0);
    Am_Value_List::operator=((Am_Value_List *)local_30,pAVar3);
    local_6a = Am_Value_List::Valid((Am_Value_List *)local_30);
    uVar2 = Am_Value_List::Length((Am_Value_List *)local_30);
    Am_Object::Set(new_object,0x85,(uint)uVar2,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
    Am_Value_List::Add((Am_Value_List *)local_30,pAVar4,Am_TAIL,false);
    local_78 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)new_object,100);
    Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_move,0,&local_78);
    if ((local_6a & 1) == 0) {
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_30);
      Am_Object::Set(owner,0x82,pAVar4,0);
    }
    else {
      Am_Object::Note_Changed(owner,0x82);
    }
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return;
}

Assistant:

void
am_generic_add_part(Am_Object owner, Am_Object old_object, Am_Object new_object)
{
  Am_Value_List components;
  if (old_object.Valid() && old_object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    components = owner.Get(Am_GRAPHICAL_PARTS);
    components.Start();
    if (components.Member(old_object)) {
      components.Delete(false);
      int current_rank = old_object.Get(Am_RANK);
      components.Next();
      Am_Object current_obj;
      while (!components.Last()) {
        current_obj = components.Get();
        current_obj.Set(Am_RANK, current_rank);
        ++current_rank;
        components.Next();
      }
      Main_Demon_Queue.Enqueue(
          graphics_move, 0,
          ((Am_Object_Advanced &)old_object).Get_Slot(Am_LEFT));
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
    }
  }
  if (new_object.Valid() && new_object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    components = owner.Get(Am_GRAPHICAL_PARTS);
    bool was_valid = components.Valid();
    new_object.Set(Am_RANK, (int)components.Length());
    components.Add(new_object, Am_TAIL, false);
    Main_Demon_Queue.Enqueue(
        graphics_move, 0, ((Am_Object_Advanced &)new_object).Get_Slot(Am_LEFT));
    if (was_valid)
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
    else
      owner.Set(Am_GRAPHICAL_PARTS, components);
  }
}